

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall IrSim::buildBB(IrSim *this)

{
  bool bVar1;
  int iVar2;
  pointer pIVar3;
  mapped_type_conflict *pmVar4;
  size_type sVar5;
  reference ppVar6;
  difference_type dVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  size_type sVar11;
  IrSim *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar12;
  InterCode *bbnext;
  InterCode *bbend;
  int size;
  pair<const_int,_int> *it_1;
  iterator __end1;
  iterator __begin1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  int labelNo;
  int k;
  iterator it;
  int i;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffe78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  value_type_conflict *in_stack_fffffffffffffe88;
  set<int,_std::less<int>,_std::allocator<int>_> *__x;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffe98;
  const_iterator in_stack_fffffffffffffea0;
  IrList_t *this_00;
  const_iterator in_stack_fffffffffffffea8;
  IrList_t *this_01;
  key_type *in_stack_fffffffffffffeb8;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffec0;
  _Self local_b0;
  _Self local_a8;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_a0;
  int *local_98;
  int *local_90;
  int *local_78;
  int *local_70;
  int *local_68;
  int *local_58;
  int *local_50;
  undefined4 local_44;
  int local_40;
  mapped_type_conflict local_3c;
  _Base_ptr local_38;
  undefined1 local_30;
  int local_24;
  InterCode *local_20;
  __normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_> local_18;
  int local_c;
  
  local_c = 0;
  local_18._M_current =
       (InterCode *)
       std::vector<InterCode,_std::allocator<InterCode>_>::begin
                 ((vector<InterCode,_std::allocator<InterCode>_> *)in_stack_fffffffffffffe78);
  while( true ) {
    local_20 = (InterCode *)
               std::vector<InterCode,_std::allocator<InterCode>_>::end
                         ((vector<InterCode,_std::allocator<InterCode>_> *)in_stack_fffffffffffffe78
                         );
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>::
             operator->(&local_18);
    local_24 = pIVar3->kind;
    if (local_24 == 0xd) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90._M_current,
                 in_stack_fffffffffffffe88);
      pVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffea0._M_current,in_stack_fffffffffffffe98._M_current)
      ;
      local_38 = (_Base_ptr)pVar12.first._M_node;
      local_30 = pVar12.second;
    }
    else {
      bVar1 = isGoto(in_RDI,local_24);
      if (bVar1) {
        in_stack_fffffffffffffec0 = &in_RDI->labels;
        __gnu_cxx::
        __normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>::
        operator->(&local_18);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        local_3c = *pmVar4;
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->basicBlocks);
        pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
        *pmVar4 = (mapped_type_conflict)sVar5;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90._M_current,
                   in_stack_fffffffffffffe88);
        local_40 = local_c + 1;
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffe80,(value_type_conflict *)in_stack_fffffffffffffe78);
      }
    }
    __gnu_cxx::__normal_iterator<InterCode_*,_std::vector<InterCode,_std::allocator<InterCode>_>_>::
    operator++(&local_18);
    local_c = local_c + 1;
  }
  sVar5 = std::vector<InterCode,_std::allocator<InterCode>_>::size(&in_RDI->irList);
  local_44 = (undefined4)sVar5;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_fffffffffffffe80,(value_type_conflict *)in_stack_fffffffffffffe78);
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
  local_58 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,IrSim::buildBB()::__0>
            (local_50,local_58);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
  local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
  local_68 = (int *)std::
                    unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                              (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  __k = (key_type *)&in_RDI->basicBlocks;
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffe80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffe78);
  local_90 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffe80,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffe78);
  local_98 = (int *)std::vector<int,_std::allocator<int>_>::erase
                              (in_stack_fffffffffffffe98._M_current,in_stack_fffffffffffffea8,
                               in_stack_fffffffffffffea0);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90._M_current);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_a0 = &in_RDI->labelInBB;
    local_a8._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (in_stack_fffffffffffffe78);
    local_b0._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   (in_stack_fffffffffffffe78);
    while (bVar1 = std::operator!=(&local_a8,&local_b0), bVar1) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x1101f3);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
      std::find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe78);
      dVar7 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe80,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffe78);
      ppVar6->second = (int)dVar7;
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)in_stack_fffffffffffffe80);
    }
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->basicBlocks);
    iVar2 = (int)sVar5 + -1;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::resize((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              *)in_stack_fffffffffffffea0._M_current,(size_type)in_stack_fffffffffffffe98._M_current
            );
    for (local_c = 0; local_c < iVar2; local_c = local_c + 1) {
      this_00 = &in_RDI->irList;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->basicBlocks,(long)(local_c + 1));
      pvVar9 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                         (this_00,(long)(*pvVar8 + -1));
      this_01 = &in_RDI->irList;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&in_RDI->basicBlocks,(long)(local_c + 1));
      pvVar10 = std::vector<InterCode,_std::allocator<InterCode>_>::operator[]
                          (this_01,(long)*pvVar8);
      bVar1 = isGoto(in_RDI,pvVar9->kind);
      if (bVar1) {
        in_stack_fffffffffffffe98._M_current =
             (int *)std::
                    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ::operator[](&in_RDI->edges,(long)local_c);
        in_stack_fffffffffffffe90._M_current = (int *)&in_RDI->labelInBB;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::operator[](in_stack_fffffffffffffec0,__k);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   in_stack_fffffffffffffec0,(key_type *)__k);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00,
                   in_stack_fffffffffffffe98._M_current);
      }
      if (local_c + 1 != iVar2) {
        __x = &in_RDI->functions;
        std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->basicBlocks,(long)(local_c + 1))
        ;
        sVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            in_stack_fffffffffffffe90._M_current,(key_type *)__x);
        if (sVar11 == 0) {
          if (pvVar10->kind == 0xe) {
            std::
            vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::operator[](&in_RDI->edges,(long)local_c);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](in_stack_fffffffffffffec0,__k);
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )in_stack_fffffffffffffec0,(key_type *)__k);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00,
                       in_stack_fffffffffffffe98._M_current);
          }
          else {
            std::
            vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::operator[](&in_RDI->edges,(long)local_c);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)this_00,
                       in_stack_fffffffffffffe98._M_current);
          }
        }
      }
    }
    return;
  }
  __assert_fail("!basicBlocks.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                ,0x4d,"void IrSim::buildBB()");
}

Assistant:

void IrSim::buildBB() {
    int i = 0;
    for (auto it = irList.begin(); it != irList.end(); ++it, ++i) {
        int k = it->kind;
        if (k == IC_FUNC) {
            basicBlocks.push_back(i);
            functions.insert(i);
        }
        else if (isGoto(k)) {
            int labelNo = labels[it->target.value];
            labelInBB[labelNo] = (int)basicBlocks.size();
            basicBlocks.push_back(labelNo);
            basicBlocks.push_back(i + 1);
        }
    }
    basicBlocks.push_back((int)irList.size());
    std::sort(basicBlocks.begin(), basicBlocks.end(), [](int a, int b) { return a <= b; });
    auto last = std::unique(basicBlocks.begin(), basicBlocks.end());
    basicBlocks.erase(last, basicBlocks.end());
    assert(!basicBlocks.empty());

    for (auto &it : labelInBB)
        it.second = (int)(find(basicBlocks.begin(), basicBlocks.end(), it.first) - basicBlocks.begin());
    int size = (int)basicBlocks.size() - 1;
    edges.resize((size_t)size);
    for (i = 0; i < size; ++i) { // build edges
        InterCode &bbend = irList[basicBlocks[i + 1] - 1];
        InterCode &bbnext = irList[basicBlocks[i + 1]];
        if (isGoto(bbend.kind))
            edges[i].insert(labelInBB[labels[bbend.target.value]]);
        if (i + 1 != size && functions.count(basicBlocks[i + 1]) == 0) {
            if (bbnext.kind == IC_GOTO)
                edges[i].insert(labelInBB[labels[bbnext.target.value]]);
            else
                edges[i].insert(i + 1);
        }
    }
}